

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall
wasm::PrintSExpression::handleSignature
          (PrintSExpression *this,Function *curr,bool printImplicitNames)

{
  size_t *this_00;
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  Type type;
  bool local_c9;
  BasicType local_ac;
  Type local_a8;
  uintptr_t local_a0;
  string_view local_98;
  bool local_81;
  Type *pTStack_80;
  bool hasName;
  Type *param;
  Iterator __end1;
  Iterator __begin1;
  Type *__range1;
  Index i;
  bool inParam;
  string_view local_30;
  byte local_19;
  Function *pFStack_18;
  bool printImplicitNames_local;
  Function *curr_local;
  PrintSExpression *this_local;
  
  local_19 = printImplicitNames;
  pFStack_18 = curr;
  curr_local = (Function *)this;
  std::operator<<(this->o,'(');
  poVar3 = this->o;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_30,"func ");
  printMajor(poVar3,local_30);
  wasm::Name::print((Name *)pFStack_18,this->o);
  if (((this->currModule != (Module *)0x0) &&
      (bVar1 = FeatureSet::hasGC(&this->currModule->features), bVar1)) ||
     (bVar1 = requiresExplicitFuncType((HeapType)(pFStack_18->type).id), bVar1)) {
    std::operator<<(this->o," (type ");
    poVar3 = printHeapTypeName(this,(HeapType)(pFStack_18->type).id);
    std::operator<<(poVar3,')');
  }
  bVar1 = false;
  __range1._0_4_ = 0;
  __begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)Function::getParams(pFStack_18);
  this_00 = &__begin1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
  join_0x00000010_0x00000000_ =
       (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
       wasm::Type::begin((Type *)this_00);
  _param = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)
           wasm::Type::end((Type *)this_00);
  while (bVar2 = ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator!=
                           ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                            &__end1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index,(ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
                                   &param), bVar2) {
    pTStack_80 = wasm::Type::Iterator::operator*
                           ((Iterator *)
                            &__end1.
                             super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                             index);
    local_c9 = true;
    if ((local_19 & 1) == 0) {
      local_c9 = Function::hasLocalName(pFStack_18,(Index)__range1);
    }
    local_81 = local_c9;
    if ((local_c9 == false) || (!bVar1)) {
      if (bVar1) {
        std::operator<<(this->o,' ');
      }
      else {
        std::operator<<(this->o,this->maybeSpace);
      }
    }
    else {
      poVar3 = std::operator<<(this->o,')');
      std::operator<<(poVar3,this->maybeSpace);
      bVar1 = false;
    }
    if (!bVar1) {
      std::operator<<(this->o,'(');
      poVar3 = this->o;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_98,"param ");
      printMinor(poVar3,local_98);
      bVar1 = true;
    }
    if ((local_81 & 1U) != 0) {
      anon_unknown_0::printLocal((Index)__range1,this->currFunction,this->o);
      std::operator<<(this->o,' ');
    }
    local_a0 = pTStack_80->id;
    printType(this,(Type)local_a0);
    if ((local_81 & 1U) != 0) {
      std::operator<<(this->o,')');
      bVar1 = false;
    }
    __range1._0_4_ = (Index)__range1 + 1;
    ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>::operator++
              ((ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> *)
               &__end1.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index);
  }
  if (bVar1) {
    std::operator<<(this->o,')');
  }
  local_a8 = Function::getResults(pFStack_18);
  local_ac = none;
  bVar1 = wasm::Type::operator!=(&local_a8,&local_ac);
  if (bVar1) {
    std::operator<<(this->o,this->maybeSpace);
    type = Function::getResults(pFStack_18);
    printResultType(this,type);
  }
  return;
}

Assistant:

void PrintSExpression::handleSignature(Function* curr,
                                       bool printImplicitNames) {
  o << '(';
  printMajor(o, "func ");
  curr->name.print(o);
  if ((currModule && currModule->features.hasGC()) ||
      requiresExplicitFuncType(curr->type)) {
    o << " (type ";
    printHeapTypeName(curr->type) << ')';
  }
  bool inParam = false;
  Index i = 0;
  for (const auto& param : curr->getParams()) {
    auto hasName = printImplicitNames || curr->hasLocalName(i);
    if (hasName && inParam) {
      o << ')' << maybeSpace;
      inParam = false;
    } else if (inParam) {
      o << ' ';
    } else {
      o << maybeSpace;
    }
    if (!inParam) {
      o << '(';
      printMinor(o, "param ");
      inParam = true;
    }
    if (hasName) {
      printLocal(i, currFunction, o);
      o << ' ';
    }
    printType(param);
    if (hasName) {
      o << ')';
      inParam = false;
    }
    ++i;
  }
  if (inParam) {
    o << ')';
  }
  if (curr->getResults() != Type::none) {
    o << maybeSpace;
    printResultType(curr->getResults());
  }
}